

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::status_internal::MakeCheckFailString
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  pointer pcVar1;
  string *__return_storage_ptr__;
  AlphaNum *in_R9;
  string local_100;
  AlphaNum local_e0;
  string_view local_b0 [3];
  AlphaNum local_80;
  AlphaNum local_50;
  
  __return_storage_ptr__ = (string *)operator_new(0x20);
  local_b0[0] = NullSafeStringView(prefix);
  local_e0.piece_ = NullSafeStringView(" (");
  Status::ToString_abi_cxx11_(&local_100,status,kWithEverything);
  local_50.piece_._M_len = local_100._M_string_length;
  local_50.piece_._M_str = local_100._M_dataplus._M_p;
  local_80.piece_ = NullSafeStringView(")");
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_b0,&local_e0,&local_50,&local_80,
                    in_R9);
  DoIgnoreLeak(__return_storage_ptr__);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::~string((string *)&local_100);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(
             new std::string(absl::StrCat(
                 prefix, " (",
                 status->ToString(StatusToStringMode::kWithEverything), ")")))
      ->c_str();
}